

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O2

void __thiscall
duckdb::TextTreeRenderer::RenderBottomLayer
          (TextTreeRenderer *this,RenderTree *root,ostream *ss,idx_t y)

{
  ostream *poVar1;
  bool bVar2;
  bool bVar3;
  optional_ptr<duckdb::RenderTreeNode,_true> oVar4;
  char **ppcVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong x;
  allocator local_a1;
  ostream *local_a0;
  idx_t local_98;
  TextTreeRenderer *local_90;
  string local_88;
  idx_t local_68;
  string local_60;
  char **local_40;
  char **local_38;
  
  local_68 = y + 1;
  x = 0;
  local_38 = &(this->config).TMIDDLE;
  local_40 = &(this->config).HORIZONTAL;
  local_a0 = ss;
  local_90 = this;
  do {
    uVar6 = root->width;
    if ((uVar6 < x) || ((this->config).maximum_render_width <= (this->config).node_render_width * x)
       ) {
      ::std::operator<<(ss,'\n');
      return;
    }
    local_98 = x;
    bVar3 = false;
    for (; iVar7 = local_98, x < uVar6; x = x + 1) {
      bVar2 = true;
      if (bVar3 == false) {
        bVar2 = RenderTree::HasNode(root,x,y);
        uVar6 = root->width;
      }
      bVar3 = bVar2;
    }
    oVar4 = RenderTree::GetNode(root,local_98,y);
    this = local_90;
    if (oVar4.ptr == (RenderTreeNode *)0x0) {
      bVar2 = RenderTree::HasNode(root,iVar7,local_68);
      this = local_90;
      iVar7 = local_98;
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&local_60," ",&local_a1);
        this = local_90;
        StringUtil::Repeat(&local_88,&local_60,(local_90->config).node_render_width >> 1);
        ss = local_a0;
        ::std::operator<<(local_a0,(string *)&local_88);
        ::std::__cxx11::string::~string((string *)&local_88);
        ::std::__cxx11::string::~string((string *)&local_60);
        ::std::operator<<(ss,(this->config).VERTICAL);
        iVar7 = local_98;
        if (bVar3 == false) {
          bVar3 = ShouldRenderWhitespace(root,local_98,y);
          if (!bVar3) goto LAB_008dc11f;
        }
        ::std::__cxx11::string::string((string *)&local_60," ",&local_a1);
        StringUtil::Repeat(&local_88,&local_60,(this->config).node_render_width >> 1);
        ::std::operator<<(local_a0,(string *)&local_88);
        ::std::__cxx11::string::~string((string *)&local_88);
      }
      else {
        if (bVar3 == false) {
          bVar3 = ShouldRenderWhitespace(root,local_98,y);
          if (!bVar3) goto LAB_008dc11f;
        }
        ::std::__cxx11::string::string((string *)&local_60," ",&local_a1);
        StringUtil::Repeat(&local_88,&local_60,(this->config).node_render_width);
        ::std::operator<<(local_a0,(string *)&local_88);
        ::std::__cxx11::string::~string((string *)&local_88);
      }
      ::std::__cxx11::string::~string((string *)&local_60);
      ss = local_a0;
    }
    else {
      ::std::operator<<(ss,(local_90->config).LDCORNER);
      ::std::__cxx11::string::string((string *)&local_60,(this->config).HORIZONTAL,&local_a1);
      StringUtil::Repeat(&local_88,&local_60,((this->config).node_render_width >> 1) - 1);
      iVar7 = local_98;
      poVar1 = local_a0;
      ::std::operator<<(local_a0,(string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_60);
      bVar3 = RenderTree::HasNode(root,iVar7,local_68);
      ppcVar5 = local_40;
      if (bVar3) {
        ppcVar5 = local_38;
      }
      ::std::operator<<(poVar1,*ppcVar5);
      ::std::__cxx11::string::string((string *)&local_60,(this->config).HORIZONTAL,&local_a1);
      StringUtil::Repeat(&local_88,&local_60,((this->config).node_render_width >> 1) - 1);
      ss = local_a0;
      ::std::operator<<(local_a0,(string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_60);
      ::std::operator<<(ss,(this->config).RDCORNER);
    }
LAB_008dc11f:
    x = iVar7 + 1;
  } while( true );
}

Assistant:

void TextTreeRenderer::RenderBottomLayer(RenderTree &root, std::ostream &ss, idx_t y) {
	for (idx_t x = 0; x <= root.width; x++) {
		if (x * config.node_render_width >= config.maximum_render_width) {
			break;
		}
		bool has_adjacent_nodes = false;
		for (idx_t i = 0; x + i < root.width; i++) {
			has_adjacent_nodes = has_adjacent_nodes || root.HasNode(x + i, y);
		}
		auto node = root.GetNode(x, y);
		if (node) {
			ss << config.LDCORNER;
			ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2 - 1);
			if (root.HasNode(x, y + 1)) {
				// node below this one: connect to that one
				ss << config.TMIDDLE;
			} else {
				// no node below this one: end the box
				ss << config.HORIZONTAL;
			}
			ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2 - 1);
			ss << config.RDCORNER;
		} else if (root.HasNode(x, y + 1)) {
			ss << StringUtil::Repeat(" ", config.node_render_width / 2);
			ss << config.VERTICAL;
			if (has_adjacent_nodes || ShouldRenderWhitespace(root, x, y)) {
				ss << StringUtil::Repeat(" ", config.node_render_width / 2);
			}
		} else {
			if (has_adjacent_nodes || ShouldRenderWhitespace(root, x, y)) {
				ss << StringUtil::Repeat(" ", config.node_render_width);
			}
		}
	}
	ss << '\n';
}